

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptxinfo.cpp
# Opt level: O0

void DumpFaceInfo(FaceInfo *f)

{
  bool bVar1;
  int iVar2;
  EdgeId EVar3;
  ostream *poVar4;
  FaceInfo *in_RDI;
  Res res;
  Res local_a;
  FaceInfo *local_8;
  
  local_a = in_RDI->res;
  local_8 = in_RDI;
  poVar4 = std::operator<<((ostream *)&std::cout,"  res: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)local_a.ulog2);
  poVar4 = std::operator<<(poVar4,' ');
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)local_a.vlog2);
  poVar4 = std::operator<<(poVar4," (");
  iVar2 = Ptex::v2_2::Res::u(&local_a);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  poVar4 = std::operator<<(poVar4," x ");
  iVar2 = Ptex::v2_2::Res::v(&local_a);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  poVar4 = std::operator<<(poVar4,")");
  poVar4 = std::operator<<(poVar4,"  adjface: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_8->adjfaces[0]);
  poVar4 = std::operator<<(poVar4,' ');
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_8->adjfaces[1]);
  poVar4 = std::operator<<(poVar4,' ');
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_8->adjfaces[2]);
  poVar4 = std::operator<<(poVar4,' ');
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_8->adjfaces[3]);
  poVar4 = std::operator<<(poVar4,"  adjedge: ");
  EVar3 = Ptex::v2_2::FaceInfo::adjedge(local_8,0);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,EVar3);
  poVar4 = std::operator<<(poVar4,' ');
  EVar3 = Ptex::v2_2::FaceInfo::adjedge(local_8,1);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,EVar3);
  poVar4 = std::operator<<(poVar4,' ');
  EVar3 = Ptex::v2_2::FaceInfo::adjedge(local_8,2);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,EVar3);
  poVar4 = std::operator<<(poVar4,' ');
  EVar3 = Ptex::v2_2::FaceInfo::adjedge(local_8,3);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,EVar3);
  std::operator<<(poVar4,"  flags:");
  if (local_8->flags == '\0') {
    std::operator<<((ostream *)&std::cout," (none)");
  }
  else {
    bVar1 = Ptex::v2_2::FaceInfo::isSubface(local_8);
    if (bVar1) {
      std::operator<<((ostream *)&std::cout," subface");
    }
    bVar1 = Ptex::v2_2::FaceInfo::isConstant(local_8);
    if (bVar1) {
      std::operator<<((ostream *)&std::cout," constant");
    }
    bVar1 = Ptex::v2_2::FaceInfo::isNeighborhoodConstant(local_8);
    if (bVar1) {
      std::operator<<((ostream *)&std::cout," nbconstant");
    }
    bVar1 = Ptex::v2_2::FaceInfo::hasEdits(local_8);
    if (bVar1) {
      std::operator<<((ostream *)&std::cout," hasedits");
    }
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void DumpFaceInfo(const Ptex::FaceInfo& f)
{
    Ptex::Res res = f.res;
    std::cout << "  res: " << int(res.ulog2) << ' ' << int(res.vlog2)
              << " (" << res.u() << " x " << res.v() << ")"
              << "  adjface: " 
              << f.adjfaces[0] << ' '
              << f.adjfaces[1] << ' '
              << f.adjfaces[2] << ' '
              << f.adjfaces[3]
              << "  adjedge: " 
              << f.adjedge(0) << ' '
              << f.adjedge(1) << ' '
              << f.adjedge(2) << ' '
              << f.adjedge(3)
              << "  flags:";
    // output flag names
    if (f.flags == 0) std::cout << " (none)";
    else {
        if (f.isSubface()) std::cout << " subface";
        if (f.isConstant()) std::cout << " constant";
        if (f.isNeighborhoodConstant()) std::cout << " nbconstant";
        if (f.hasEdits()) std::cout << " hasedits";
    }
    std::cout << std::endl;
}